

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O0

DdNode * cuddZddWeakDiv(DdManager *dd,DdNode *f,DdNode *g)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  int flag;
  DdNode *r;
  DdNode *tmp;
  DdNode *q;
  DdNode *gd;
  DdNode *g1;
  DdNode *g0;
  DdNode *fd;
  DdNode *f1;
  DdNode *f0;
  DdNode *zero;
  DdNode *one;
  DdNode *pDStack_28;
  int v;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  zero = dd->one;
  f0 = dd->zero;
  dd_local = (DdManager *)f;
  if ((((g != zero) && (dd_local = (DdManager *)f0, f != f0)) && (f != zero)) &&
     ((dd_local = (DdManager *)zero, f != g &&
      (pDStack_28 = g, g_local = f, f_local = &dd->sentinel,
      dd_local = (DdManager *)cuddCacheLookup2Zdd(dd,cuddZddWeakDiv,f,g),
      dd_local == (DdManager *)0x0)))) {
    one._4_4_ = pDStack_28->index;
    iVar1 = cuddZddGetCofactors3((DdManager *)f_local,g_local,one._4_4_,&fd,&f1,&g0);
    if (iVar1 == 1) {
      dd_local = (DdManager *)0x0;
    }
    else {
      Cudd_Ref(fd);
      Cudd_Ref(f1);
      Cudd_Ref(g0);
      iVar1 = cuddZddGetCofactors3((DdManager *)f_local,pDStack_28,one._4_4_,&gd,&g1,&q);
      if (iVar1 == 1) {
        Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
        Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
        Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
        dd_local = (DdManager *)0x0;
      }
      else {
        Cudd_Ref(gd);
        Cudd_Ref(g1);
        Cudd_Ref(q);
        tmp = pDStack_28;
        if (g1 == f0) {
          Cudd_Ref(pDStack_28);
        }
        else {
          tmp = cuddZddWeakDiv((DdManager *)f_local,f1,g1);
          if (tmp == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
            return (DdNode *)0x0;
          }
          Cudd_Ref(tmp);
        }
        Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
        Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
        if (tmp == f0) {
          Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
          Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
          cuddCacheInsert2((DdManager *)f_local,cuddZddWeakDiv,g_local,pDStack_28,f0);
          Cudd_Deref(tmp);
          dd_local = (DdManager *)f0;
        }
        else {
          if (gd == f0) {
            Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
            pDVar2 = tmp;
          }
          else {
            Cudd_RecursiveDerefZdd((DdManager *)f_local,tmp);
            pDVar2 = cuddZddWeakDiv((DdManager *)f_local,fd,gd);
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
              return (DdNode *)0x0;
            }
            Cudd_Ref(pDVar2);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
            if (tmp != pDStack_28) {
              pDVar3 = cuddZddIntersect((DdManager *)f_local,tmp,pDVar2);
              if (pDVar3 == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
                return (DdNode *)0x0;
              }
              Cudd_Ref(pDVar3);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
              pDVar2 = pDVar3;
            }
          }
          tmp = pDVar2;
          if (tmp == f0) {
            Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
            cuddCacheInsert2((DdManager *)f_local,cuddZddWeakDiv,g_local,pDStack_28,f0);
            Cudd_Deref(tmp);
            dd_local = (DdManager *)f0;
          }
          else {
            if (q == f0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
              pDVar2 = tmp;
            }
            else {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,tmp);
              pDVar2 = cuddZddWeakDiv((DdManager *)f_local,g0,q);
              if (pDVar2 == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
                return (DdNode *)0x0;
              }
              Cudd_Ref(pDVar2);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,q);
              if (tmp != pDStack_28) {
                pDVar3 = cuddZddIntersect((DdManager *)f_local,tmp,pDVar2);
                if (pDVar3 == (DdNode *)0x0) {
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                  return (DdNode *)0x0;
                }
                Cudd_Ref(pDVar3);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                pDVar2 = pDVar3;
              }
            }
            tmp = pDVar2;
            cuddCacheInsert2((DdManager *)f_local,cuddZddWeakDiv,g_local,pDStack_28,tmp);
            Cudd_Deref(tmp);
            dd_local = (DdManager *)tmp;
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode  *
cuddZddWeakDiv(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    int         v;
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = DD_ZERO(dd);
    DdNode      *f0, *f1, *fd, *g0, *g1, *gd;
    DdNode      *q, *tmp;
    DdNode      *r;
    int         flag;

    statLine(dd);
    if (g == one)
        return(f);
    if (f == zero || f == one)
        return(zero);
    if (f == g)
        return(one);

    /* Check cache. */
    r = cuddCacheLookup2Zdd(dd, cuddZddWeakDiv, f, g);
    if (r)
        return(r);

    v = g->index;

    flag = cuddZddGetCofactors3(dd, f, v, &f1, &f0, &fd);
    if (flag == 1)
        return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    Cudd_Ref(fd);
    flag = cuddZddGetCofactors3(dd, g, v, &g1, &g0, &gd);
    if (flag == 1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        return(NULL);
    }
    Cudd_Ref(g1);
    Cudd_Ref(g0);
    Cudd_Ref(gd);

    q = g;

    if (g0 != zero) {
        q = cuddZddWeakDiv(dd, f0, g0);
        if (q == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, g0);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(q);
    }
    else
        Cudd_Ref(q);
    Cudd_RecursiveDerefZdd(dd, f0);
    Cudd_RecursiveDerefZdd(dd, g0);

    if (q == zero) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        cuddCacheInsert2(dd, cuddZddWeakDiv, f, g, zero);
        Cudd_Deref(q);
        return(zero);
    }

    if (g1 != zero) {
        Cudd_RecursiveDerefZdd(dd, q);
        tmp = cuddZddWeakDiv(dd, f1, g1);
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
        if (q == g)
            q = tmp;
        else {
            q = cuddZddIntersect(dd, q, tmp);
            if (q == NULL) {
                Cudd_RecursiveDerefZdd(dd, fd);
                Cudd_RecursiveDerefZdd(dd, gd);
                return(NULL);
            }
            Cudd_Ref(q);
            Cudd_RecursiveDerefZdd(dd, tmp);
        }
    }
    else {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, g1);
    }

    if (q == zero) {
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        cuddCacheInsert2(dd, cuddZddWeakDiv, f, g, zero);
        Cudd_Deref(q);
        return(zero);
    }

    if (gd != zero) {
        Cudd_RecursiveDerefZdd(dd, q);
        tmp = cuddZddWeakDiv(dd, fd, gd);
        if (tmp == NULL) {
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDerefZdd(dd, gd);
            return(NULL);
        }
        Cudd_Ref(tmp);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
        if (q == g)
            q = tmp;
        else {
            q = cuddZddIntersect(dd, q, tmp);
            if (q == NULL) {
                Cudd_RecursiveDerefZdd(dd, tmp);
                return(NULL);
            }
            Cudd_Ref(q);
            Cudd_RecursiveDerefZdd(dd, tmp);
        }
    }
    else {
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, gd);
    }

    cuddCacheInsert2(dd, cuddZddWeakDiv, f, g, q);
    Cudd_Deref(q);
    return(q);

}